

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O2

void __thiscall
testing::internal::TypedExpectation<BasicTestExpr<1>_(TestCallExprBuilder)>::~TypedExpectation
          (TypedExpectation<BasicTestExpr<1>_(TestCallExprBuilder)> *this)

{
  linked_ptr<testing::ActionInterface<BasicTestExpr<1>_(TestCallExprBuilder)>_> *this_00;
  pointer ppvVar1;
  
  (this->super_ExpectationBase)._vptr_ExpectationBase =
       (_func_int **)&PTR__TypedExpectation_002bbb30;
  ExpectationBase::CheckActionCountIfNotDone(&this->super_ExpectationBase);
  for (ppvVar1 = (this->super_ExpectationBase).untyped_actions_.
                 super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      ppvVar1 !=
      (this->super_ExpectationBase).untyped_actions_.
      super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppvVar1 = ppvVar1 + 1) {
    this_00 = (linked_ptr<testing::ActionInterface<BasicTestExpr<1>_(TestCallExprBuilder)>_> *)
              *ppvVar1;
    if (this_00 !=
        (linked_ptr<testing::ActionInterface<BasicTestExpr<1>_(TestCallExprBuilder)>_> *)0x0) {
      linked_ptr<testing::ActionInterface<BasicTestExpr<1>_(TestCallExprBuilder)>_>::~linked_ptr
                (this_00);
    }
    operator_delete(this_00,0x10);
  }
  linked_ptr<testing::ActionInterface<BasicTestExpr<1>_(TestCallExprBuilder)>_>::~linked_ptr
            (&(this->repeated_action_).impl_);
  MatcherBase<const_std::tuple<TestCallExprBuilder>_&>::~MatcherBase
            (&(this->extra_matcher_).super_MatcherBase<const_std::tuple<TestCallExprBuilder>_&>);
  MatcherBase<TestCallExprBuilder>::~MatcherBase
            ((MatcherBase<TestCallExprBuilder> *)&this->matchers_);
  ExpectationBase::~ExpectationBase(&this->super_ExpectationBase);
  return;
}

Assistant:

virtual ~TypedExpectation() {
    // Check the validity of the action count if it hasn't been done
    // yet (for example, if the expectation was never used).
    CheckActionCountIfNotDone();
    for (UntypedActions::const_iterator it = untyped_actions_.begin();
         it != untyped_actions_.end(); ++it) {
      delete static_cast<const Action<F>*>(*it);
    }
  }